

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

int __thiscall NavierStokesBase::nghost_state(NavierStokesBase *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = amrex::EBFArrayBoxFactory::isAllRegular
                    ((EBFArrayBoxFactory *)
                     (this->super_AmrLevel).m_factory._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl);
  iVar2 = 4;
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    iVar2 = 3 - (uint)(iVar2 == 0);
  }
  return iVar2;
}

Assistant:

int
NavierStokesBase::nghost_state ()
{
#ifdef AMREX_USE_EB
  if (!EBFactory().isAllRegular())
  {
        return 4;
  }
  else
#endif
  {
    return (advection_scheme == "MOL" ) ? 2 : 3;
}
}